

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  uint uVar1;
  GLFWbool GVar2;
  uint in_EDX;
  uint in_ESI;
  _GLFWwindow *in_RDI;
  int i_1;
  int i;
  _GLFWwindow *window;
  int local_20;
  int local_1c;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    switch(in_ESI) {
    case 0x33001:
      if ((((in_EDX == 0x34001) || (in_EDX == 0x34002)) || (in_EDX == 0x34003)) ||
         (in_EDX == 0x34004)) {
        if (in_RDI->cursorMode != in_EDX) {
          in_RDI->cursorMode = in_EDX;
          (*_glfw.platform.getCursorPos)
                    (in_RDI,&in_RDI->virtualCursorPosX,&in_RDI->virtualCursorPosY);
          (*_glfw.platform.setCursorMode)(in_RDI,in_EDX);
        }
      }
      else {
        _glfwInputError(0x10003,"Invalid cursor mode 0x%08X",(ulong)in_EDX);
      }
      break;
    case 0x33002:
      uVar1 = (uint)(in_EDX != 0);
      if (in_RDI->stickyKeys != uVar1) {
        if (uVar1 == 0) {
          for (local_1c = 0; local_1c < 0x15d; local_1c = local_1c + 1) {
            if (in_RDI->keys[local_1c] == '\x03') {
              in_RDI->keys[local_1c] = '\0';
            }
          }
        }
        in_RDI->stickyKeys = uVar1;
      }
      break;
    case 0x33003:
      uVar1 = (uint)(in_EDX != 0);
      if (in_RDI->stickyMouseButtons != uVar1) {
        if (uVar1 == 0) {
          for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
            if (in_RDI->mouseButtons[local_20] == '\x03') {
              in_RDI->mouseButtons[local_20] = '\0';
            }
          }
        }
        in_RDI->stickyMouseButtons = uVar1;
      }
      break;
    case 0x33004:
      in_RDI->lockKeyMods = (uint)(in_EDX != 0);
      break;
    case 0x33005:
      GVar2 = (*_glfw.platform.rawMouseMotionSupported)();
      if (GVar2 == 0) {
        _glfwInputError(0x10008,"Raw mouse motion is not supported on this system");
      }
      else {
        uVar1 = (uint)(in_EDX != 0);
        if (in_RDI->rawMouseMotion != uVar1) {
          in_RDI->rawMouseMotion = uVar1;
          (*_glfw.platform.setRawMouseMotion)(in_RDI,uVar1);
        }
      }
      break;
    default:
      _glfwInputError(0x10003,"Invalid input mode 0x%08X",(ulong)in_ESI);
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    switch (mode)
    {
        case GLFW_CURSOR:
        {
            if (value != GLFW_CURSOR_NORMAL &&
                value != GLFW_CURSOR_HIDDEN &&
                value != GLFW_CURSOR_DISABLED &&
                value != GLFW_CURSOR_CAPTURED)
            {
                _glfwInputError(GLFW_INVALID_ENUM,
                                "Invalid cursor mode 0x%08X",
                                value);
                return;
            }

            if (window->cursorMode == value)
                return;

            window->cursorMode = value;

            _glfw.platform.getCursorPos(window,
                                        &window->virtualCursorPosX,
                                        &window->virtualCursorPosY);
            _glfw.platform.setCursorMode(window, value);
            return;
        }

        case GLFW_STICKY_KEYS:
        {
            value = value ? GLFW_TRUE : GLFW_FALSE;
            if (window->stickyKeys == value)
                return;

            if (!value)
            {
                int i;

                // Release all sticky keys
                for (i = 0;  i <= GLFW_KEY_LAST;  i++)
                {
                    if (window->keys[i] == _GLFW_STICK)
                        window->keys[i] = GLFW_RELEASE;
                }
            }

            window->stickyKeys = value;
            return;
        }

        case GLFW_STICKY_MOUSE_BUTTONS:
        {
            value = value ? GLFW_TRUE : GLFW_FALSE;
            if (window->stickyMouseButtons == value)
                return;

            if (!value)
            {
                int i;

                // Release all sticky mouse buttons
                for (i = 0;  i <= GLFW_MOUSE_BUTTON_LAST;  i++)
                {
                    if (window->mouseButtons[i] == _GLFW_STICK)
                        window->mouseButtons[i] = GLFW_RELEASE;
                }
            }

            window->stickyMouseButtons = value;
            return;
        }

        case GLFW_LOCK_KEY_MODS:
        {
            window->lockKeyMods = value ? GLFW_TRUE : GLFW_FALSE;
            return;
        }

        case GLFW_RAW_MOUSE_MOTION:
        {
            if (!_glfw.platform.rawMouseMotionSupported())
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Raw mouse motion is not supported on this system");
                return;
            }

            value = value ? GLFW_TRUE : GLFW_FALSE;
            if (window->rawMouseMotion == value)
                return;

            window->rawMouseMotion = value;
            _glfw.platform.setRawMouseMotion(window, value);
            return;
        }
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode 0x%08X", mode);
}